

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.h
# Opt level: O0

void __thiscall
kj::
CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++:417:45),_kj::Array<char>_>
::~CaptureByMove(CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_test_c__:417:45),_kj::Array<char>_>
                 *this)

{
  CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_test_c__:417:45),_kj::Array<char>_>
  *this_local;
  
  Array<char>::~Array(&this->param);
  return;
}

Assistant:

inline CaptureByMove(Func&& func, MovedParam&& param)
      : func(kj::mv(func)), param(kj::mv(param)) {}